

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftinit.c
# Opt level: O0

FT_Error FT_Init_FreeType(FT_Library *alibrary)

{
  FT_Memory memory_00;
  FT_Memory memory;
  FT_Error error;
  FT_Library *alibrary_local;
  
  memory_00 = FT_New_Memory();
  if (memory_00 == (FT_Memory)0x0) {
    alibrary_local._4_4_ = 7;
  }
  else {
    alibrary_local._4_4_ = FT_New_Library(memory_00,alibrary);
    if (alibrary_local._4_4_ == 0) {
      FT_Add_Default_Modules(*alibrary);
    }
    else {
      FT_Done_Memory(memory_00);
    }
    FT_Set_Default_Properties(*alibrary);
  }
  return alibrary_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Init_FreeType( FT_Library  *alibrary )
  {
    FT_Error   error;
    FT_Memory  memory;


    /* check of `alibrary' delayed to `FT_New_Library' */

    /* First of all, allocate a new system object -- this function is part */
    /* of the system-specific component, i.e. `ftsystem.c'.                */

    memory = FT_New_Memory();
    if ( !memory )
    {
      FT_ERROR(( "FT_Init_FreeType: cannot find memory manager\n" ));
      return FT_THROW( Unimplemented_Feature );
    }

    /* build a library out of it, then fill it with the set of */
    /* default drivers.                                        */

    error = FT_New_Library( memory, alibrary );
    if ( error )
      FT_Done_Memory( memory );
    else
      FT_Add_Default_Modules( *alibrary );

    FT_Set_Default_Properties( *alibrary );

    return error;
  }